

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  byte *pbVar1;
  int iVar2;
  symbol **ppsVar3;
  symbol *psVar4;
  symbol *psVar5;
  ushort *puVar6;
  undefined8 *puVar7;
  FILE *__nmemb;
  uint uVar8;
  int iVar9;
  uint uVar10;
  void *__s;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  ushort **ppuVar14;
  void *pvVar15;
  char *pcVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  char cVar20;
  char *pcVar21;
  FILE *__stream;
  long lVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  
  iVar2 = lemp->nsymbol;
  lVar23 = (long)iVar2;
  __nmemb = (FILE *)(lVar23 * 2);
  pcVar21 = (char *)0x8;
  __stream = __nmemb;
  __s = calloc((size_t)__nmemb,8);
  if (__s == (void *)0x0) {
LAB_0010bb54:
    print_stack_union_cold_3();
  }
  else {
    uVar8 = (uint)__nmemb;
    if (0 < iVar2) {
      uVar19 = 1;
      if (1 < (int)uVar8) {
        uVar19 = (ulong)__nmemb & 0xffffffff;
      }
      pcVar21 = (char *)0x0;
      memset(__s,0,uVar19 << 3);
    }
    pcVar18 = lemp->vartype;
    if (pcVar18 == (char *)0x0) {
      sVar11 = 0;
    }
    else {
      sVar11 = strlen(pcVar18);
    }
    iVar9 = (int)sVar11;
    if (0 < iVar2) {
      ppsVar3 = lemp->symbols;
      lVar22 = 0;
      do {
        pcVar13 = ppsVar3[lVar22]->datatype;
        if (pcVar13 != (char *)0x0) {
          sVar12 = strlen(pcVar13);
          uVar10 = (uint)sVar12;
          if ((int)(uint)sVar12 < (int)(uint)sVar11) {
            uVar10 = (uint)sVar11;
          }
          sVar11 = (size_t)uVar10;
        }
        iVar9 = (int)sVar11;
        lVar22 = lVar22 + 1;
      } while (lVar23 != lVar22);
    }
    __stream = (FILE *)(long)(iVar9 * 2 + 1);
    pcVar13 = (char *)malloc((size_t)__stream);
    if (pcVar13 != (char *)0x0) {
      if (0 < iVar2) {
        ppsVar3 = lemp->symbols;
        psVar4 = lemp->errsym;
        lVar22 = 0;
        do {
          psVar5 = ppsVar3[lVar22];
          uVar10 = uVar8 | 1;
          if (((psVar5 == psVar4) || (uVar10 = 0, psVar5->type != NONTERMINAL)) ||
             (pcVar21 = psVar5->datatype, pcVar18 == (char *)0x0 && pcVar21 == (char *)0x0)) {
LAB_0010b922:
            psVar5->dtnum = uVar10;
          }
          else {
            if (pcVar21 == (char *)0x0) {
              pcVar21 = pcVar18;
            }
            ppuVar14 = __ctype_b_loc();
            puVar6 = *ppuVar14;
            pcVar16 = pcVar21 + -1;
            do {
              pcVar21 = pcVar21 + 1;
              pbVar1 = (byte *)(pcVar16 + 1);
              pcVar16 = pcVar16 + 1;
            } while ((*(byte *)((long)puVar6 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
            uVar19 = 0;
            cVar20 = *pcVar16;
            while (cVar20 != '\0') {
              pcVar13[uVar19] = cVar20;
              uVar19 = uVar19 + 1;
              cVar20 = *pcVar21;
              pcVar21 = pcVar21 + 1;
            }
            if (0 < (int)uVar19) {
              do {
                iVar9 = (int)uVar19;
                if ((*(byte *)((long)puVar6 +
                              (ulong)(byte)pcVar13[(uVar19 & 0xffffffff) - 1] * 2 + 1) & 0x20) == 0)
                goto LAB_0010b83c;
                uVar19 = (ulong)(iVar9 - 1);
              } while (1 < iVar9);
              uVar19 = 0;
            }
LAB_0010b83c:
            pcVar13[(int)uVar19] = '\0';
            pcVar21 = lemp->tokentype;
            if ((pcVar21 != (char *)0x0) && (iVar9 = strcmp(pcVar13,pcVar21), iVar9 == 0)) {
              uVar10 = 0;
              goto LAB_0010b922;
            }
            cVar20 = *pcVar13;
            uVar10 = 0;
            pcVar16 = pcVar13;
            if (cVar20 != '\0') {
              do {
                pcVar21 = (char *)(ulong)(uVar10 * 0x35);
                uVar10 = (int)cVar20 + uVar10 * 0x35;
                cVar20 = pcVar16[1];
                pcVar16 = pcVar16 + 1;
              } while (cVar20 != '\0');
              uVar10 = uVar10 & 0x7fffffff;
            }
            uVar19 = (ulong)uVar10 % ((ulong)__nmemb & 0xffffffff);
            uVar10 = (uint)uVar19;
            pcVar16 = *(char **)((long)__s + uVar19 * 8);
            bVar25 = pcVar16 == (char *)0x0;
            if (bVar25) {
LAB_0010b93b:
              psVar5->dtnum = uVar10 + 1;
              sVar11 = strlen(pcVar13);
              __stream = (FILE *)(long)((int)sVar11 + 1);
              pvVar15 = malloc((size_t)__stream);
              *(void **)((long)__s + uVar19 * 8) = pvVar15;
              if (pvVar15 == (void *)0x0) {
                print_stack_union_cold_1();
                goto LAB_0010bb54;
              }
              lVar17 = 0;
              do {
                cVar20 = pcVar13[lVar17];
                *(char *)((long)pvVar15 + lVar17) = cVar20;
                lVar17 = lVar17 + 1;
              } while (cVar20 != '\0');
            }
            else {
              pcVar21 = pcVar13;
              iVar9 = strcmp(pcVar16,pcVar13);
              while (uVar10 = (uint)uVar19, iVar9 != 0) {
                uVar10 = uVar10 + 1;
                if (uVar8 <= uVar10) {
                  uVar10 = 0;
                }
                uVar19 = (ulong)uVar10;
                pcVar16 = *(char **)((long)__s + uVar19 * 8);
                bVar25 = pcVar16 == (char *)0x0;
                if (bVar25) goto LAB_0010b93b;
                pcVar21 = pcVar13;
                iVar9 = strcmp(pcVar16,pcVar13);
              }
              psVar5->dtnum = uVar10 + 1;
              pcVar21 = pcVar18;
              if (bVar25) goto LAB_0010b93b;
            }
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != lVar23);
      }
      pcVar21 = "Parse";
      if (lemp->name != (char *)0x0) {
        pcVar21 = lemp->name;
      }
      iVar9 = *plineno;
      if (mhflag != 0) {
        fwrite("#if INTERFACE\n",0xe,1,(FILE *)out);
        iVar9 = iVar9 + 1;
      }
      pcVar18 = "void*";
      if (lemp->tokentype != (char *)0x0) {
        pcVar18 = lemp->tokentype;
      }
      fprintf((FILE *)out,"#define %sTOKENTYPE %s\n",pcVar21,pcVar18);
      if (mhflag == 0) {
        iVar9 = iVar9 + 1;
      }
      else {
        fwrite("#endif\n",7,1,(FILE *)out);
        iVar9 = iVar9 + 2;
      }
      fwrite("typedef union {\n",0x10,1,(FILE *)out);
      fwrite("  int yyinit;\n",0xe,1,(FILE *)out);
      fprintf((FILE *)out,"  %sTOKENTYPE yy0;\n",pcVar21);
      iVar9 = iVar9 + 3;
      if (0 < iVar2) {
        uVar19 = 1;
        if (1 < (int)uVar8) {
          uVar19 = (ulong)__nmemb & 0xffffffff;
        }
        uVar24 = 0;
        do {
          pvVar15 = *(void **)((long)__s + uVar24 * 8);
          if (pvVar15 != (void *)0x0) {
            fprintf((FILE *)out,"  %s yy%d;\n",pvVar15,(ulong)((int)uVar24 + 1));
            iVar9 = iVar9 + 1;
            free(pvVar15);
          }
          uVar24 = uVar24 + 1;
        } while (uVar19 != uVar24);
      }
      psVar4 = lemp->errsym;
      if ((psVar4 != (symbol *)0x0) && (psVar4->useCnt != 0)) {
        fprintf((FILE *)out,"  int yy%d;\n",(ulong)(uint)psVar4->dtnum);
        iVar9 = iVar9 + 1;
      }
      free(pcVar13);
      free(__s);
      fwrite("} YYMINORTYPE;\n",0xf,1,(FILE *)out);
      *plineno = iVar9 + 1;
      return;
    }
  }
  print_stack_union_cold_2();
  fprintf(__stream,"%s ::=",**(undefined8 **)pcVar21);
  if (0 < *(int *)(pcVar21 + 0x18)) {
    lVar23 = 0;
    do {
      puVar7 = *(undefined8 **)(*(long *)(pcVar21 + 0x20) + lVar23 * 8);
      if (*(int *)((long)puVar7 + 0xc) == 2) {
        fprintf(__stream," %s",**(undefined8 **)puVar7[0xc]);
        if (1 < *(int *)(puVar7 + 0xb)) {
          lVar22 = 1;
          do {
            fprintf(__stream,"|%s",**(undefined8 **)(puVar7[0xc] + lVar22 * 8));
            lVar22 = lVar22 + 1;
          } while (lVar22 < *(int *)(puVar7 + 0xb));
        }
      }
      else {
        fprintf(__stream," %s",*puVar7);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < *(int *)(pcVar21 + 0x18));
  }
  return;
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = *plineno;    /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  unsigned hash;            /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  if( types==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( ISSPACE(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && ISSPACE(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=(unsigned)arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      lemon_strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym && lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}